

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::PlyParser::parseElementDescr
          (PlyParser *this,stringstream *cin,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *header)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  reference pvVar3;
  mapped_type *pmVar4;
  Tag TVar5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  istream *in_RSI;
  key_type *in_RDI;
  Type TVar6;
  string name_1;
  Type ty;
  string tag;
  stringstream line;
  size_t num;
  string name;
  Element elt;
  char *in_stack_fffffffffffffca8;
  Element *in_stack_fffffffffffffcb0;
  value_type *in_stack_fffffffffffffcb8;
  value_type *__x;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  string *this_00;
  value_type local_308;
  Type local_2e8;
  Type local_2d8;
  int local_2cc;
  string local_2c8 [32];
  stringstream *in_stack_fffffffffffffd58;
  PlyParser *in_stack_fffffffffffffd60;
  ulong local_120 [3];
  string local_108 [32];
  string local_e8 [32];
  ulong local_c8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Element::Element(in_stack_fffffffffffffcb0);
  this_00 = local_108;
  std::__cxx11::string::string(this_00);
  std::operator>>(local_10,this_00);
  std::istream::operator>>(local_10,local_120);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
              in_stack_fffffffffffffcb8);
  std::__cxx11::string::operator=(local_e8,local_108);
  local_c8 = local_120[0];
  do {
    bVar1 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar3 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcb0);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&stack0xfffffffffffffd58,(string *)pvVar3,_Var2);
    std::__cxx11::string::string(local_2c8);
    std::operator>>((istream *)&stack0xfffffffffffffd58,local_2c8);
    bVar1 = std::operator!=(&in_stack_fffffffffffffcb0->name,in_stack_fffffffffffffca8);
    if (bVar1) {
      local_2cc = 3;
    }
    else {
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffcb0);
      TVar6 = parseType(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      TVar5 = TVar6.data;
      __x = &local_308;
      local_2e8 = TVar6;
      local_2d8 = TVar6;
      std::__cxx11::string::string((string *)__x);
      std::operator>>((istream *)&stack0xfffffffffffffd58,(string *)__x);
      in_stack_fffffffffffffcb0 =
           (Element *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Type>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Type>_>_>
                         *)this_00,in_RDI);
      *(Type *)&in_stack_fffffffffffffcb0->name = local_2d8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(TVar5,in_stack_fffffffffffffcc0),__x);
      std::__cxx11::string::~string((string *)&local_308);
      local_2cc = 0;
    }
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffd58);
  } while (local_2cc == 0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
                         *)this_00,in_RDI);
  Element::operator=(in_stack_fffffffffffffcb0,pmVar4);
  std::__cxx11::string::~string(local_108);
  Element::~Element(in_stack_fffffffffffffcb0);
  return;
}

Assistant:

void parseElementDescr(std::stringstream& cin, std::list<std::string>& header) 
      {
        Element elt;
        std::string name; cin >> name;
        size_t num; cin >> num;
        mesh.order.push_back(name);
        elt.name = name;
        elt.size = num;
  
        /* parse all properties */
        while (!header.empty())
        {
          std::stringstream line(header.front()); 
          std::string tag; line >> tag;
          if (tag != "property") break;
          header.pop_front();
          
          Type ty = parseType(line);
          std::string name; line >> name;
          elt.type[name] = ty; 
          elt.properties.push_back(name);
        }

        mesh.elements[name] = elt;
      }